

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monotone.c
# Opt level: O2

Vec_Int_t * findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone,Vec_Int_t *vHintMonotone)

{
  int Entry;
  int iVar1;
  Vec_Int_t *p;
  int i;
  
  p = vHintMonotone;
  if ((vKnownMonotone != (Vec_Int_t *)0x0) && (0 < vKnownMonotone->nSize)) {
    p = Vec_IntAlloc((int)vKnownMonotone);
    for (i = 0; i < vHintMonotone->nSize; i = i + 1) {
      Entry = Vec_IntEntry(vHintMonotone,i);
      iVar1 = Vec_IntFind(vKnownMonotone,Entry);
      if (iVar1 == -1) {
        Vec_IntPush(p,Entry);
      }
    }
  }
  return p;
}

Assistant:

Vec_Int_t *findRemainingMonotoneCandidates(Vec_Int_t *vKnownMonotone, Vec_Int_t *vHintMonotone)
{
    Vec_Int_t *vCandMonotone;
    int iElem, i;

    if( vKnownMonotone == NULL || Vec_IntSize(vKnownMonotone) <= 0 )
        return vHintMonotone;
    vCandMonotone = Vec_IntAlloc(0);
    Vec_IntForEachEntry( vHintMonotone, iElem, i )
    {
        if( Vec_IntFind( vKnownMonotone, iElem ) == -1 )
            Vec_IntPush( vCandMonotone, iElem );
    }
    
    return vCandMonotone;
}